

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adler32.cc
# Opt level: O0

void __thiscall adler32_variant::hash(adler32_variant *this,adler32_test param,adler32_func adler32)

{
  undefined1 uVar1;
  code *in_RSI;
  undefined4 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined4 in_stack_0000001c;
  AssertHelper *in_stack_00000020;
  AssertionResult gtest_ar;
  uint32_t adler;
  AssertHelper *this_00;
  AssertionResult *this_01;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  Type in_stack_ffffffffffffffcc;
  AssertHelper *in_stack_ffffffffffffffd0;
  AssertionResult local_28;
  undefined4 local_14;
  
  this_00 = (AssertHelper *)&stack0x00000008;
  local_14 = (*in_RSI)(in_stack_00000008,in_stack_00000010,in_stack_00000018);
  this_01 = &local_28;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),(uint *)this_01,
             (uint *)this_00);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x13ff71);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc,(char *)CONCAT17(uVar1,in_stack_ffffffffffffffb0));
    testing::internal::AssertHelper::operator=
              (in_stack_00000020,(Message *)CONCAT44(in_stack_0000001c,in_stack_00000018));
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x13ffbd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13fffd);
  return;
}

Assistant:

void hash(adler32_test param, adler32_func adler32) {
        uint32_t adler = adler32((uint32_t)param.adler, param.buf, param.len);
        EXPECT_EQ(adler, param.expect);
    }